

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_artist.cpp
# Opt level: O0

void __thiscall polyscope::VectorArtist::draw(VectorArtist *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  element_type *peVar4;
  ScaledValue<float> *pSVar5;
  vec<3,_float,_(glm::qualifier)0> *pvVar6;
  float *pfVar7;
  long in_RDI;
  float fVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar9;
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar10;
  vec4 vVar11;
  mat4 Pinv;
  mat4 P;
  ShaderProgram *in_stack_00000378;
  Structure *in_stack_00000380;
  nullptr_t in_stack_fffffffffffffd78;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffd80;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [112];
  VectorArtist *in_stack_ffffffffffffff00;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  undefined8 local_80;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_78;
  undefined8 local_70;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  bVar3 = std::operator==((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffd80,
                          in_stack_fffffffffffffd78);
  if (bVar3) {
    createProgram(in_stack_ffffffffffffff00);
  }
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffd80);
  Structure::setTransformUniforms(in_stack_00000380,in_stack_00000378);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d1826);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"u_radius",&local_29);
  pSVar5 = PersistentValue<polyscope::ScaledValue<float>_>::get
                     ((PersistentValue<polyscope::ScaledValue<float>_> *)(in_RDI + 0x90));
  fVar8 = ScaledValue<float>::asAbsolute(pSVar5);
  (*peVar4->_vptr_ShaderProgram[5])((ulong)(uint)fVar8,peVar4,local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d18e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"u_baseColor",&local_61);
  pvVar6 = PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get
                     ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)(in_RDI + 0xb8));
  local_78 = pvVar6->field_2;
  local_80._0_4_ = pvVar6->field_0;
  local_80._4_4_ = pvVar6->field_1;
  local_70 = local_80;
  local_68 = local_78;
  (*peVar4->_vptr_ShaderProgram[9])(local_80,(ulong)(uint)local_78,peVar4,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (*(int *)(in_RDI + 0x48) == 1) {
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d19ea);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"u_lengthMult",&local_a1);
    (*peVar4->_vptr_ShaderProgram[6])(0x3ff0000000000000,peVar4,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else {
    peVar4 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3d1b50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"u_lengthMult",&local_c9);
    pSVar5 = PersistentValue<polyscope::ScaledValue<float>_>::get
                       ((PersistentValue<polyscope::ScaledValue<float>_> *)(in_RDI + 0x68));
    fVar8 = ScaledValue<float>::asAbsolute(pSVar5);
    (*peVar4->_vptr_ShaderProgram[6])((double)fVar8 / *(double *)(in_RDI + 0x60),peVar4,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  view::getCameraPerspectiveMatrix();
  glm::inverse<4,4,float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)in_stack_fffffffffffffd80);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d1c7c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"u_invProjMatrix",&local_171);
  pfVar7 = glm::value_ptr<float,(glm::qualifier)0>((mat<4,_4,_float,_(glm::qualifier)0> *)0x3d1cbb);
  (*peVar4->_vptr_ShaderProgram[7])(peVar4,local_170,pfVar7);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d1d0d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"u_viewport",&local_199);
  uVar9 = extraout_XMM0_Qb;
  uVar10 = extraout_XMM1_Qb;
  vVar11 = render::Engine::getCurrentViewport(render::engine);
  auVar1._8_8_ = uVar10;
  auVar1._0_8_ = vVar11._8_8_;
  auVar2._8_8_ = uVar9;
  auVar2._0_8_ = vVar11._0_8_;
  uVar9 = vmovlpd_avx(auVar2);
  uVar10 = vmovlpd_avx(auVar1);
  (*peVar4->_vptr_ShaderProgram[10])(uVar9,uVar10,peVar4,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  peVar4 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d1dd0);
  (*peVar4->_vptr_ShaderProgram[0x1e])();
  return;
}

Assistant:

void VectorArtist::draw() {
  if (program == nullptr) {
    createProgram();
  }

  // Set uniforms
  parentStructure.setTransformUniforms(*program);

  program->setUniform("u_radius", vectorRadius.get().asAbsolute());
  program->setUniform("u_baseColor", vectorColor.get());

  if (vectorType == VectorType::AMBIENT) {
    program->setUniform("u_lengthMult", 1.0);
  } else {
    program->setUniform("u_lengthMult", vectorLengthMult.get().asAbsolute() / maxLength);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  program->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  program->setUniform("u_viewport", render::engine->getCurrentViewport());

  program->draw();
}